

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbtBvhTriangleMeshShape.cpp
# Opt level: O1

void __thiscall
cbtBvhTriangleMeshShape::processAllTriangles::MyNodeOverlapCallback::processNode
          (MyNodeOverlapCallback *this,int nodeSubPart,int nodeTriangleIndex)

{
  float fVar1;
  cbtStridingMeshInterface *pcVar2;
  float fVar3;
  float fVar4;
  ulong uVar5;
  int iVar6;
  cbtScalar *pcVar7;
  long lVar8;
  uint uVar9;
  long lVar10;
  float fVar11;
  PHY_ScalarType indicestype;
  ulong local_60;
  uchar *vertexbase;
  int numfaces;
  int indexstride;
  int stride;
  PHY_ScalarType type;
  int numverts;
  uchar *indexbase;
  
  local_60 = (ulong)(uint)nodeSubPart;
  this->m_numOverlap = this->m_numOverlap + 1;
  (*this->m_meshInterface->_vptr_cbtStridingMeshInterface[4])
            (this->m_meshInterface,&vertexbase,&numverts,&type,&stride,&indexbase,&indexstride,
             &numfaces,&indicestype,local_60);
  uVar5 = local_60;
  iVar6 = indexstride * nodeTriangleIndex;
  pcVar2 = this->m_meshInterface;
  pcVar7 = this->m_triangle[2].m_floats + 3;
  lVar8 = 0;
  do {
    if (indicestype == PHY_INTEGER) {
      uVar9 = *(uint *)(indexbase + lVar8 * 4 + (long)iVar6 + 8);
    }
    else if (indicestype == PHY_SHORT) {
      uVar9 = (uint)*(ushort *)(indexbase + lVar8 * 2 + (long)iVar6 + 4);
    }
    else {
      uVar9 = (uint)indexbase[lVar8 + (long)iVar6 + 2];
    }
    lVar10 = (long)(int)uVar9 * (long)stride;
    if (type == PHY_FLOAT) {
      fVar3 = *(float *)(vertexbase + lVar10) * (pcVar2->m_scaling).m_floats[0];
      fVar4 = *(float *)(vertexbase + lVar10 + 4) * (pcVar2->m_scaling).m_floats[1];
      fVar11 = *(float *)(vertexbase + lVar10 + 8);
    }
    else {
      fVar3 = (float)*(double *)(vertexbase + lVar10) * (pcVar2->m_scaling).m_floats[0];
      fVar4 = (float)*(double *)(vertexbase + lVar10 + 8) * (pcVar2->m_scaling).m_floats[1];
      fVar11 = (float)*(double *)(vertexbase + lVar10 + 0x10);
    }
    fVar1 = (pcVar2->m_scaling).m_floats[2];
    ((cbtVector3 *)(pcVar7 + -3))->m_floats[0] = fVar3;
    pcVar7[-2] = fVar4;
    pcVar7[-1] = fVar11 * fVar1;
    *pcVar7 = 0.0;
    pcVar7 = pcVar7 + -4;
    lVar8 = lVar8 + -1;
  } while (lVar8 != -3);
  (*this->m_callback->_vptr_cbtTriangleCallback[2])
            (this->m_callback,this->m_triangle,local_60 & 0xffffffff,(ulong)(uint)nodeTriangleIndex)
  ;
  (*this->m_meshInterface->_vptr_cbtStridingMeshInterface[6])
            (this->m_meshInterface,uVar5 & 0xffffffff);
  return;
}

Assistant:

virtual void processNode(int nodeSubPart, int nodeTriangleIndex)
		{
			m_numOverlap++;
			const unsigned char* vertexbase;
			int numverts;
			PHY_ScalarType type;
			int stride;
			const unsigned char* indexbase;
			int indexstride;
			int numfaces;
			PHY_ScalarType indicestype;

			m_meshInterface->getLockedReadOnlyVertexIndexBase(
				&vertexbase,
				numverts,
				type,
				stride,
				&indexbase,
				indexstride,
				numfaces,
				indicestype,
				nodeSubPart);

			unsigned int* gfxbase = (unsigned int*)(indexbase + nodeTriangleIndex * indexstride);
			cbtAssert(indicestype == PHY_INTEGER || indicestype == PHY_SHORT || indicestype == PHY_UCHAR);

			const cbtVector3& meshScaling = m_meshInterface->getScaling();
			for (int j = 2; j >= 0; j--)
			{
				int graphicsindex = indicestype == PHY_SHORT ? ((unsigned short*)gfxbase)[j] : indicestype == PHY_INTEGER ? gfxbase[j] : ((unsigned char*)gfxbase)[j];

#ifdef DEBUG_TRIANGLE_MESH
				printf("%d ,", graphicsindex);
#endif  //DEBUG_TRIANGLE_MESH
				if (type == PHY_FLOAT)
				{
					float* graphicsbase = (float*)(vertexbase + graphicsindex * stride);

					m_triangle[j] = cbtVector3(
						graphicsbase[0] * meshScaling.getX(),
						graphicsbase[1] * meshScaling.getY(),
						graphicsbase[2] * meshScaling.getZ());
				}
				else
				{
					double* graphicsbase = (double*)(vertexbase + graphicsindex * stride);

					m_triangle[j] = cbtVector3(
						cbtScalar(graphicsbase[0]) * meshScaling.getX(),
						cbtScalar(graphicsbase[1]) * meshScaling.getY(),
						cbtScalar(graphicsbase[2]) * meshScaling.getZ());
				}
#ifdef DEBUG_TRIANGLE_MESH
				printf("triangle vertices:%f,%f,%f\n", triangle[j].x(), triangle[j].y(), triangle[j].z());
#endif  //DEBUG_TRIANGLE_MESH
			}

			m_callback->processTriangle(m_triangle, nodeSubPart, nodeTriangleIndex);
			m_meshInterface->unLockReadOnlyVertexBase(nodeSubPart);
		}